

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

lbool __thiscall Minisat::SimpSolver::solve_(SimpSolver *this,bool do_simp,bool turn_off_simp)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Lit *pLVar5;
  char *pcVar6;
  undefined8 *puVar7;
  int *piVar8;
  byte in_DL;
  byte in_SIL;
  Solver *in_RDI;
  SimpSolver *this_00;
  double dVar9;
  double dVar10;
  SATchecker *this_01;
  int i_2;
  int i_1;
  Var v;
  int i;
  int pre_simplification_units;
  double simp_time;
  vec<int> extra_frozen;
  lbool result;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>
  *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  undefined1 dealloc;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int iVar11;
  SimpSolver *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  int local_60;
  lbool local_5b;
  uint8_t local_5a;
  lbool local_59;
  int local_58;
  lbool local_51;
  int local_50;
  int local_4c;
  int in_stack_ffffffffffffffb8;
  SimpSolver *pSVar12;
  vec<int> local_28;
  byte local_12;
  byte local_11;
  lbool local_1;
  
  local_11 = in_SIL & 1;
  local_12 = in_DL & 1;
  vec<int>::vec(&local_28);
  lbool::lbool(&local_1,'\0');
  in_RDI->systematic_branching_state = 1;
  local_11 = (byte)in_RDI[1].status_every & local_11 & 1;
  this_00 = (SimpSolver *)cpuTime();
  pSVar12 = this_00;
  iVar3 = vec<Minisat::Lit>::size(&in_RDI->trail);
  iVar11 = iVar3;
  if ((local_11 & 1) != 0) {
    in_stack_ffffffffffffff84 = 0;
    while (in_stack_ffffffffffffffb8 = in_stack_ffffffffffffff84,
          in_stack_ffffffffffffff88 = vec<Minisat::Lit>::size(&in_RDI->assumptions),
          in_stack_ffffffffffffff84 < in_stack_ffffffffffffff88) {
      pLVar5 = vec<Minisat::Lit>::operator[](&in_RDI->assumptions,in_stack_ffffffffffffffb8);
      local_50 = pLVar5->x;
      local_4c = var((Lit)local_50);
      pcVar6 = vec<char>::operator[]((vec<char> *)&in_RDI[1].propagations,local_4c);
      if (*pcVar6 == '\0') {
        setFrozen((SimpSolver *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                  (Var)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                  SUB81((ulong)in_stack_ffffffffffffff18 >> 0x18,0));
        vec<int>::push((vec<int> *)in_stack_ffffffffffffff10,
                       (int *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
      }
      in_stack_ffffffffffffff84 = in_stack_ffffffffffffffb8 + 1;
    }
    bVar2 = eliminate(this_00,SUB41((uint)iVar3 >> 0x18,0));
    lbool::lbool(&local_51,bVar2);
    local_1.value = local_51.value;
  }
  dealloc = (undefined1)((ulong)in_stack_ffffffffffffff18 >> 0x38);
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::clear
            (in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f);
  vec<char>::clear((vec<char> *)in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f);
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::clear
            (in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f);
  vec<int>::clear((vec<int> *)in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f);
  Heap<Minisat::SimpSolver::ElimLt>::clear
            ((Heap<Minisat::SimpSolver::ElimLt> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),(bool)dealloc);
  Queue<unsigned_int>::clear
            ((Queue<unsigned_int> *)in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f);
  dVar9 = cpuTime();
  dVar9 = dVar9 - (double)pSVar12;
  in_RDI->check_satisfiability_simplified = true;
  if (in_RDI->solves == 1) {
    vec<Minisat::Lit>::clear
              ((vec<Minisat::Lit> *)in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f);
    local_58 = iVar11;
    vec<Minisat::Lit>::push
              ((vec<Minisat::Lit> *)in_stack_ffffffffffffff10,
               (Lit *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    iVar11 = local_58;
    for (; iVar1 = local_58, iVar4 = vec<Minisat::Lit>::size(&in_RDI->trail), iVar1 < iVar4;
        local_58 = local_58 + 1) {
      pLVar5 = vec<Minisat::Lit>::operator[](&in_RDI->trail,local_58);
      in_stack_ffffffffffffff40 = (SimpSolver *)vec<Minisat::Lit>::operator[](&in_RDI->add_tmp,0);
      *(int *)&(in_stack_ffffffffffffff40->super_Solver)._vptr_Solver = pLVar5->x;
      Solver::shareViaCallback<Minisat::vec<Minisat::Lit>>
                (&this_00->super_Solver,
                 (vec<Minisat::Lit> *)CONCAT44(iVar3,in_stack_ffffffffffffff88),
                 in_stack_ffffffffffffff84);
    }
    vec<Minisat::Lit>::clear
              ((vec<Minisat::Lit> *)in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f);
  }
  lbool::lbool(&local_59,'\0');
  bVar2 = lbool::operator==(&local_1,local_59);
  if (bVar2) {
    local_5a = (uint8_t)Solver::solve_(in_RDI);
    local_1 = (lbool)local_5a;
  }
  else if (0 < in_RDI->verbosity) {
    printf("c ===============================================================================\n");
  }
  dVar10 = cpuTime();
  this_01 = (SATchecker *)(dVar10 - dVar9);
  lbool::lbool(&local_5b,'\0');
  bVar2 = lbool::operator==(&local_1,local_5b);
  if ((bVar2) && (extendModel(in_stack_ffffffffffffff40), (in_RDI->check_satisfiability & 1U) != 0))
  {
    bVar2 = Solver::SATchecker::checkModel
                      (this_01,(vec<Minisat::lbool> *)CONCAT44(iVar11,in_stack_ffffffffffffffb8));
    if (!bVar2) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar7 = "ERROR: detected model that does not satisfy input formula, abort";
      __cxa_throw(puVar7,&char_const*::typeinfo,0);
    }
    if (in_RDI->verbosity != 0) {
      printf("c validated SAT answer after extending model\n");
    }
  }
  if ((local_11 & 1) != 0) {
    local_60 = 0;
    while (iVar11 = local_60, iVar3 = vec<int>::size(&local_28), iVar11 < iVar3) {
      piVar8 = vec<int>::operator[](&local_28,local_60);
      setFrozen((SimpSolver *)CONCAT44(iVar11,in_stack_ffffffffffffff20),
                (Var)((ulong)piVar8 >> 0x20),SUB81((ulong)piVar8 >> 0x18,0));
      local_60 = local_60 + 1;
    }
  }
  in_RDI->systematic_branching_state = 0;
  dVar9 = cpuTime();
  (in_RDI->statistics).simpSeconds = (dVar9 - (double)this_01) + (in_RDI->statistics).simpSeconds;
  vec<int>::~vec((vec<int> *)0x15adec);
  return (lbool)local_1.value;
}

Assistant:

lbool SimpSolver::solve_(bool do_simp, bool turn_off_simp)
{
    vec<Var> extra_frozen;
    lbool result = l_True;

    systematic_branching_state = 1;

    do_simp &= use_simplification;
    double simp_time = cpuTime();

    const int pre_simplification_units = trail.size();

    if (do_simp) {
        // Assumptions must be temporarily frozen to run variable elimination:
        for (int i = 0; i < assumptions.size(); i++) {
            Var v = var(assumptions[i]);

            // If an assumption has been eliminated, remember it.
            assert(!isEliminated(v));

            if (!frozen[v]) {
                // Freeze and store.
                setFrozen(v, true);
                extra_frozen.push(v);
            }
        }

        result = lbool(eliminate(turn_off_simp));
    }
    occurs.clear(true);
    touched.clear(true);
    occurs.clear(true);
    n_occ.clear(true);
    elim_heap.clear(true);
    subsumption_queue.clear(true);

    simp_time = cpuTime() - simp_time;      // stop timer and record time consumed until now
    check_satisfiability_simplified = true; // only check SAT answer after the call to extendModel()

    /* share units during initial call, only really useful in case preprocessing is used */
    if (solves == 1) {
        assert(decisionLevel() == 0);
        add_tmp.clear();
        add_tmp.push(lit_Undef);
        for (int i = pre_simplification_units; i < trail.size(); ++i) {
            add_tmp[0] = trail[i];
            shareViaCallback(add_tmp, 1);
        }
        add_tmp.clear();
    }

    if (result == l_True)
        result = Solver::solve_();
    else if (verbosity >= 1)
        printf("c ===============================================================================\n");

    simp_time = cpuTime() - simp_time; // continue timer and consider time tracked already

    if (result == l_True) {
        extendModel();
        if (check_satisfiability) {
            if (!satChecker.checkModel(model)) {
                assert(false && "model should satisfy full input formula");
                throw("ERROR: detected model that does not satisfy input formula, abort");
                exit(1);
            } else if (verbosity)
                printf("c validated SAT answer after extending model\n");
        }
    }

    if (do_simp)
        // Unfreeze the assumptions that were frozen:
        for (int i = 0; i < extra_frozen.size(); i++) setFrozen(extra_frozen[i], false);

    systematic_branching_state = 0;
    statistics.simpSeconds += cpuTime() - simp_time; // stop timer and record time consumed until now

    return result;
}